

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::interleave<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int dstride,int nchan)

{
  uchar *puVar1;
  uchar *end;
  uchar *sp;
  uchar *dp;
  uchar *rowend;
  uchar *drow;
  uchar *dstend;
  int dstride_local;
  uchar *dst_local;
  int vw_local;
  int uw_local;
  int sstride_local;
  uchar *src_local;
  
  src_local = src;
  for (dst_local = dst; dst_local != dst + nchan; dst_local = dst_local + 1) {
    drow = dst_local;
    puVar1 = src_local + (sstride / 1) * vw;
    for (; src_local != puVar1; src_local = src_local + sstride / 1) {
      dp = drow;
      sp = src_local;
      while (sp != src_local + uw) {
        *dp = *sp;
        dp = dp + nchan;
        sp = sp + 1;
      }
      drow = drow + dstride / 1;
    }
  }
  return;
}

Assistant:

inline void interleave(const T* src, int sstride, int uw, int vw,
                           T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        // for each channel
        for (T* dstend = dst + nchan; dst != dstend; dst++) {
            // for each row
            T* drow = dst;
            for (const T* rowend = src + sstride*vw; src != rowend;
                 src += sstride, drow += dstride) {
                // copy each pixel across the row
                T* dp = drow;
                for (const T* sp = src, * end = sp + uw; sp != end; dp += nchan)
                    *dp = *sp++;
            }
        }
    }